

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

birth_stage get_confirm_command(void)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  keypress kVar4;
  birth_stage local_20;
  birth_stage next;
  keypress ke;
  char *prompt;
  
  local_20 = BIRTH_RESET;
  iVar1 = Term->wid;
  iVar2 = Term->hgt;
  sVar3 = strlen("[\'ESC\' to step back, \'S\' to start over, or any other key to continue]");
  prt("[\'ESC\' to step back, \'S\' to start over, or any other key to continue]",
      iVar2 + L'\xffffffff',iVar1 / 2 - (int)(sVar3 >> 1));
  kVar4 = inkey();
  next = kVar4.code;
  if ((next == 0x53) || (next == 0x73)) {
    local_20 = BIRTH_RESET;
  }
  else if (next == 0x18) {
    quit((char *)0x0);
  }
  else if (next == 0xe000) {
    local_20 = BIRTH_BACK;
  }
  else {
    cmdq_push(CMD_ACCEPT_CHARACTER);
    local_20 = BIRTH_COMPLETE;
  }
  clear_from(L'\x17');
  return local_20;
}

Assistant:

static enum birth_stage get_confirm_command(void)
{
	const char *prompt = "['ESC' to step back, 'S' to start over, or any other key to continue]";
	struct keypress ke;

	enum birth_stage next = BIRTH_RESET;

	/* Prompt for it */
	prt(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Get a key */
	ke = inkey();
	
	/* Start over */
	if (ke.code == 'S' || ke.code == 's') {
		next = BIRTH_RESET;
	} else if (ke.code == KTRL('X')) {
		quit(NULL);
	} else if (ke.code == ESCAPE) {
		next = BIRTH_BACK;
	} else {
		cmdq_push(CMD_ACCEPT_CHARACTER);
		next = BIRTH_COMPLETE;
	}

	/* Clear prompt */
	clear_from(23);

	return next;
}